

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O2

void png_read_filter_row_paeth3_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined7 uVar5;
  ulong uVar6;
  undefined5 uVar7;
  undefined1 auVar8 [16];
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [16];
  short sVar18;
  ushort uVar19;
  short sVar22;
  ushort uVar23;
  short sVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  short sVar32;
  ushort uVar33;
  undefined1 auVar20 [14];
  short sVar34;
  ushort uVar35;
  char cVar36;
  ushort uVar37;
  undefined4 uVar39;
  char cVar43;
  ushort uVar44;
  char cVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar52;
  ushort uVar53;
  short sVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  short sVar59;
  ushort uVar60;
  short sVar61;
  ushort uVar62;
  short sVar63;
  ushort uVar64;
  short sVar65;
  ushort uVar66;
  short sVar67;
  ushort uVar68;
  undefined1 auVar54 [16];
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  byte bVar17;
  undefined1 auVar21 [16];
  undefined4 uVar38;
  
  uVar10 = row_info->rowbytes;
  lVar9 = 0;
  auVar11 = (undefined1  [16])0x0;
  auVar41 = (undefined1  [16])0x0;
  while( true ) {
    sVar52 = auVar41._0_2_;
    sVar18 = auVar11._0_2_ - sVar52;
    sVar55 = auVar41._2_2_;
    sVar22 = auVar11._2_2_ - sVar55;
    sVar57 = auVar41._4_2_;
    sVar24 = auVar11._4_2_ - sVar57;
    sVar26 = auVar11._6_2_ - auVar41._6_2_;
    sVar12 = auVar41._8_2_;
    sVar28 = auVar11._8_2_ - sVar12;
    sVar13 = auVar41._10_2_;
    sVar30 = auVar11._10_2_ - sVar13;
    sVar14 = auVar41._12_2_;
    sVar32 = auVar11._12_2_ - sVar14;
    sVar15 = auVar41._14_2_;
    sVar34 = auVar11._14_2_ - sVar15;
    if (uVar10 < 4) break;
    uVar39 = *(undefined4 *)(prev + lVar9);
    bVar17 = (byte)((uint)uVar39 >> 0x18);
    uVar5 = CONCAT25((short)(((uint7)bVar17 << 0x30) >> 0x28),
                     CONCAT14((char)((uint)uVar39 >> 0x10),uVar39));
    uVar19 = (ushort)uVar39;
    uVar6 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar5 >> 0x20),uVar39) >> 0x18),
                            CONCAT12((char)((uint)uVar39 >> 8),uVar19)) & 0xffffffff00ffffff;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = CONCAT62((int6)(uVar6 >> 0x10),uVar19) & 0xffffffffffff00ff;
    uVar39 = *(undefined4 *)(row + lVar9);
    sVar52 = (uVar19 & 0xff) - sVar52;
    sVar55 = (short)(uVar6 >> 0x10) - sVar55;
    sVar57 = (short)((uint7)uVar5 >> 0x20) - sVar57;
    sVar59 = (ushort)bVar17 - auVar41._6_2_;
    sVar61 = -sVar12;
    sVar63 = -sVar13;
    sVar65 = -sVar14;
    sVar67 = -sVar15;
    sVar1 = -sVar52;
    sVar2 = -sVar55;
    sVar3 = -sVar57;
    sVar4 = -sVar59;
    uVar37 = (ushort)(sVar1 < sVar52) * sVar52 | (ushort)(sVar1 >= sVar52) * sVar1;
    uVar44 = (ushort)(sVar2 < sVar55) * sVar55 | (ushort)(sVar2 >= sVar55) * sVar2;
    uVar46 = (ushort)(sVar3 < sVar57) * sVar57 | (ushort)(sVar3 >= sVar57) * sVar3;
    uVar47 = (ushort)(sVar4 < sVar59) * sVar59 | (ushort)(sVar4 >= sVar59) * sVar4;
    uVar48 = (ushort)(sVar12 < sVar61) * sVar61 | (ushort)(sVar12 >= sVar61) * sVar12;
    uVar49 = (ushort)(sVar13 < sVar63) * sVar63 | (ushort)(sVar13 >= sVar63) * sVar13;
    uVar50 = (ushort)(sVar14 < sVar65) * sVar65 | (ushort)(sVar14 >= sVar65) * sVar14;
    uVar51 = (ushort)(sVar15 < sVar67) * sVar67 | (ushort)(sVar15 >= sVar67) * sVar15;
    sVar52 = sVar52 + sVar18;
    sVar55 = sVar55 + sVar22;
    sVar57 = sVar57 + sVar24;
    sVar59 = sVar59 + sVar26;
    sVar61 = sVar61 + sVar28;
    sVar63 = sVar63 + sVar30;
    sVar65 = sVar65 + sVar32;
    sVar67 = sVar67 + sVar34;
    sVar12 = -sVar18;
    sVar13 = -sVar22;
    sVar14 = -sVar24;
    sVar15 = -sVar26;
    sVar1 = -sVar28;
    sVar2 = -sVar30;
    sVar3 = -sVar32;
    sVar4 = -sVar34;
    uVar69 = (ushort)(sVar12 < sVar18) * sVar18 | (ushort)(sVar12 >= sVar18) * sVar12;
    uVar70 = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
    uVar71 = (ushort)(sVar14 < sVar24) * sVar24 | (ushort)(sVar14 >= sVar24) * sVar14;
    uVar72 = (ushort)(sVar15 < sVar26) * sVar26 | (ushort)(sVar15 >= sVar26) * sVar15;
    uVar73 = (ushort)(sVar1 < sVar28) * sVar28 | (ushort)(sVar1 >= sVar28) * sVar1;
    uVar74 = (ushort)(sVar2 < sVar30) * sVar30 | (ushort)(sVar2 >= sVar30) * sVar2;
    uVar75 = (ushort)(sVar3 < sVar32) * sVar32 | (ushort)(sVar3 >= sVar32) * sVar3;
    uVar76 = (ushort)(sVar4 < sVar34) * sVar34 | (ushort)(sVar4 >= sVar34) * sVar4;
    sVar12 = -sVar52;
    sVar13 = -sVar55;
    sVar14 = -sVar57;
    sVar15 = -sVar59;
    sVar18 = -sVar61;
    sVar22 = -sVar63;
    sVar24 = -sVar65;
    sVar26 = -sVar67;
    uVar19 = (ushort)(sVar12 < sVar52) * sVar52 | (ushort)(sVar12 >= sVar52) * sVar12;
    uVar23 = (ushort)(sVar13 < sVar55) * sVar55 | (ushort)(sVar13 >= sVar55) * sVar13;
    uVar25 = (ushort)(sVar14 < sVar57) * sVar57 | (ushort)(sVar14 >= sVar57) * sVar14;
    uVar27 = (ushort)(sVar15 < sVar59) * sVar59 | (ushort)(sVar15 >= sVar59) * sVar15;
    uVar29 = (ushort)(sVar18 < sVar61) * sVar61 | (ushort)(sVar18 >= sVar61) * sVar18;
    uVar31 = (ushort)(sVar22 < sVar63) * sVar63 | (ushort)(sVar22 >= sVar63) * sVar22;
    uVar33 = (ushort)(sVar24 < sVar65) * sVar65 | (ushort)(sVar24 >= sVar65) * sVar24;
    uVar35 = (ushort)(sVar26 < sVar67) * sVar67 | (ushort)(sVar26 >= sVar67) * sVar26;
    uVar53 = ((short)uVar69 < (short)uVar37) * uVar69 | ((short)uVar69 >= (short)uVar37) * uVar37;
    uVar56 = ((short)uVar70 < (short)uVar44) * uVar70 | ((short)uVar70 >= (short)uVar44) * uVar44;
    uVar58 = ((short)uVar71 < (short)uVar46) * uVar71 | ((short)uVar71 >= (short)uVar46) * uVar46;
    uVar60 = ((short)uVar72 < (short)uVar47) * uVar72 | ((short)uVar72 >= (short)uVar47) * uVar47;
    uVar62 = ((short)uVar73 < (short)uVar48) * uVar73 | ((short)uVar73 >= (short)uVar48) * uVar48;
    uVar64 = ((short)uVar74 < (short)uVar49) * uVar74 | ((short)uVar74 >= (short)uVar49) * uVar49;
    uVar66 = ((short)uVar75 < (short)uVar50) * uVar75 | ((short)uVar75 >= (short)uVar50) * uVar50;
    uVar68 = ((short)uVar76 < (short)uVar51) * uVar76 | ((short)uVar76 >= (short)uVar51) * uVar51;
    uVar19 = ((short)uVar19 < (short)uVar53) * uVar19 | ((short)uVar19 >= (short)uVar53) * uVar53;
    uVar23 = ((short)uVar23 < (short)uVar56) * uVar23 | ((short)uVar23 >= (short)uVar56) * uVar56;
    uVar25 = ((short)uVar25 < (short)uVar58) * uVar25 | ((short)uVar25 >= (short)uVar58) * uVar58;
    uVar27 = ((short)uVar27 < (short)uVar60) * uVar27 | ((short)uVar27 >= (short)uVar60) * uVar60;
    uVar29 = ((short)uVar29 < (short)uVar62) * uVar29 | ((short)uVar29 >= (short)uVar62) * uVar62;
    uVar31 = ((short)uVar31 < (short)uVar64) * uVar31 | ((short)uVar31 >= (short)uVar64) * uVar64;
    uVar33 = ((short)uVar33 < (short)uVar66) * uVar33 | ((short)uVar33 >= (short)uVar66) * uVar66;
    uVar35 = ((short)uVar35 < (short)uVar68) * uVar35 | ((short)uVar35 >= (short)uVar68) * uVar68;
    auVar40._0_2_ = -(ushort)(uVar37 == uVar19);
    auVar40._2_2_ = -(ushort)(uVar44 == uVar23);
    auVar40._4_2_ = -(ushort)(uVar46 == uVar25);
    auVar40._6_2_ = -(ushort)(uVar47 == uVar27);
    auVar40._8_2_ = -(ushort)(uVar48 == uVar29);
    auVar40._10_2_ = -(ushort)(uVar49 == uVar31);
    auVar40._12_2_ = -(ushort)(uVar50 == uVar33);
    auVar40._14_2_ = -(ushort)(uVar51 == uVar35);
    auVar54._0_2_ = -(ushort)(uVar19 == uVar69);
    auVar54._2_2_ = -(ushort)(uVar23 == uVar70);
    auVar54._4_2_ = -(ushort)(uVar25 == uVar71);
    auVar54._6_2_ = -(ushort)(uVar27 == uVar72);
    auVar54._8_2_ = -(ushort)(uVar29 == uVar73);
    auVar54._10_2_ = -(ushort)(uVar31 == uVar74);
    auVar54._12_2_ = -(ushort)(uVar33 == uVar75);
    auVar54._14_2_ = -(ushort)(uVar35 == uVar76);
    auVar41 = ~auVar40 & (~auVar54 & auVar41 | auVar16 & auVar54) | auVar11 & auVar40;
    cVar36 = auVar41[0] + (char)uVar39;
    sVar57 = CONCAT11(auVar41[1],cVar36);
    cVar43 = auVar41[2] + (char)((uint)uVar39 >> 8);
    uVar38 = CONCAT13(auVar41[3],CONCAT12(cVar43,sVar57));
    cVar45 = auVar41[4] + (char)((uint)uVar39 >> 0x10);
    auVar11._0_6_ = CONCAT15(auVar41[5],CONCAT14(cVar45,uVar38));
    auVar11[6] = auVar41[6] + (char)((uint)uVar39 >> 0x18);
    auVar11[7] = auVar41[7];
    auVar11[8] = auVar41[8];
    auVar11[9] = auVar41[9];
    auVar11[10] = auVar41[10];
    auVar11[0xb] = auVar41[0xb];
    auVar11[0xc] = auVar41[0xc];
    auVar11[0xd] = auVar41[0xd];
    auVar11[0xe] = auVar41[0xe];
    auVar11[0xf] = auVar41[0xf];
    sVar52 = (short)((uint)uVar38 >> 0x10);
    sVar55 = (short)((uint6)auVar11._0_6_ >> 0x20);
    *(ushort *)(row + lVar9) =
         CONCAT11((0 < sVar52) * (sVar52 < 0x100) * cVar43 - (0xff < sVar52),
                  (0 < sVar57) * (sVar57 < 0x100) * cVar36 - (0xff < sVar57));
    row[lVar9 + 2] = (0 < sVar55) * (sVar55 < 0x100) * cVar45 - (0xff < sVar55);
    uVar10 = uVar10 - 3;
    lVar9 = lVar9 + 3;
    auVar41 = auVar16;
  }
  if (uVar10 != 0) {
    uVar19 = *(ushort *)(prev + lVar9);
    uVar7 = CONCAT23((short)(((uint5)prev[lVar9 + 2] << 0x20) >> 0x18),
                     CONCAT12((char)(uVar19 >> 8),uVar19));
    sVar52 = (uVar19 & 0xff) - sVar52;
    sVar55 = (short)((uint5)uVar7 >> 0x10) - sVar55;
    sVar57 = (ushort)prev[lVar9 + 2] - sVar57;
    sVar26 = -sVar12;
    sVar61 = -sVar13;
    sVar63 = -sVar14;
    sVar65 = -sVar15;
    sVar67 = -sVar52;
    sVar1 = -sVar55;
    sVar2 = -sVar57;
    uVar37 = (ushort)(sVar67 < sVar52) * sVar52 | (ushort)(sVar67 >= sVar52) * sVar67;
    uVar44 = (ushort)(sVar1 < sVar55) * sVar55 | (ushort)(sVar1 >= sVar55) * sVar1;
    uVar46 = (ushort)(sVar2 < sVar57) * sVar57 | (ushort)(sVar2 >= sVar57) * sVar2;
    uVar47 = (ushort)(sVar12 < sVar26) * sVar26 | (ushort)(sVar12 >= sVar26) * sVar12;
    uVar48 = (ushort)(sVar13 < sVar61) * sVar61 | (ushort)(sVar13 >= sVar61) * sVar13;
    uVar49 = (ushort)(sVar14 < sVar63) * sVar63 | (ushort)(sVar14 >= sVar63) * sVar14;
    uVar50 = (ushort)(sVar15 < sVar65) * sVar65 | (ushort)(sVar15 >= sVar65) * sVar15;
    sVar52 = sVar52 + sVar18;
    sVar55 = sVar55 + sVar22;
    sVar57 = sVar57 + sVar24;
    sVar26 = sVar26 + sVar28;
    sVar61 = sVar61 + sVar30;
    sVar63 = sVar63 + sVar32;
    sVar65 = sVar65 + sVar34;
    sVar12 = -sVar18;
    sVar13 = -sVar22;
    sVar14 = -sVar24;
    sVar15 = -sVar28;
    sVar67 = -sVar30;
    sVar1 = -sVar32;
    sVar2 = -sVar34;
    uVar66 = (ushort)(sVar12 < sVar18) * sVar18 | (ushort)(sVar12 >= sVar18) * sVar12;
    uVar68 = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
    uVar69 = (ushort)(sVar14 < sVar24) * sVar24 | (ushort)(sVar14 >= sVar24) * sVar14;
    uVar70 = (ushort)(sVar15 < sVar28) * sVar28 | (ushort)(sVar15 >= sVar28) * sVar15;
    uVar71 = (ushort)(sVar67 < sVar30) * sVar30 | (ushort)(sVar67 >= sVar30) * sVar67;
    uVar72 = (ushort)(sVar1 < sVar32) * sVar32 | (ushort)(sVar1 >= sVar32) * sVar1;
    uVar73 = (ushort)(sVar2 < sVar34) * sVar34 | (ushort)(sVar2 >= sVar34) * sVar2;
    sVar12 = -sVar52;
    sVar13 = -sVar55;
    sVar14 = -sVar57;
    sVar15 = -sVar26;
    sVar18 = -sVar61;
    sVar22 = -sVar63;
    sVar24 = -sVar65;
    uVar51 = (ushort)(sVar12 < sVar52) * sVar52 | (ushort)(sVar12 >= sVar52) * sVar12;
    uVar53 = (ushort)(sVar13 < sVar55) * sVar55 | (ushort)(sVar13 >= sVar55) * sVar13;
    uVar56 = (ushort)(sVar14 < sVar57) * sVar57 | (ushort)(sVar14 >= sVar57) * sVar14;
    uVar58 = (ushort)(sVar15 < sVar26) * sVar26 | (ushort)(sVar15 >= sVar26) * sVar15;
    uVar60 = (ushort)(sVar18 < sVar61) * sVar61 | (ushort)(sVar18 >= sVar61) * sVar18;
    uVar62 = (ushort)(sVar22 < sVar63) * sVar63 | (ushort)(sVar22 >= sVar63) * sVar22;
    uVar64 = (ushort)(sVar24 < sVar65) * sVar65 | (ushort)(sVar24 >= sVar65) * sVar24;
    uVar23 = ((short)uVar66 < (short)uVar37) * uVar66 | ((short)uVar66 >= (short)uVar37) * uVar37;
    uVar25 = ((short)uVar68 < (short)uVar44) * uVar68 | ((short)uVar68 >= (short)uVar44) * uVar44;
    uVar27 = ((short)uVar69 < (short)uVar46) * uVar69 | ((short)uVar69 >= (short)uVar46) * uVar46;
    uVar29 = ((short)uVar70 < (short)uVar47) * uVar70 | ((short)uVar70 >= (short)uVar47) * uVar47;
    uVar31 = ((short)uVar71 < (short)uVar48) * uVar71 | ((short)uVar71 >= (short)uVar48) * uVar48;
    uVar33 = ((short)uVar72 < (short)uVar49) * uVar72 | ((short)uVar72 >= (short)uVar49) * uVar49;
    uVar35 = ((short)uVar73 < (short)uVar50) * uVar73 | ((short)uVar73 >= (short)uVar50) * uVar50;
    uVar23 = ((short)uVar51 < (short)uVar23) * uVar51 | ((short)uVar51 >= (short)uVar23) * uVar23;
    uVar25 = ((short)uVar53 < (short)uVar25) * uVar53 | ((short)uVar53 >= (short)uVar25) * uVar25;
    uVar27 = ((short)uVar56 < (short)uVar27) * uVar56 | ((short)uVar56 >= (short)uVar27) * uVar27;
    uVar29 = ((short)uVar58 < (short)uVar29) * uVar58 | ((short)uVar58 >= (short)uVar29) * uVar29;
    uVar31 = ((short)uVar60 < (short)uVar31) * uVar60 | ((short)uVar60 >= (short)uVar31) * uVar31;
    uVar33 = ((short)uVar62 < (short)uVar33) * uVar62 | ((short)uVar62 >= (short)uVar33) * uVar33;
    uVar35 = ((short)uVar64 < (short)uVar35) * uVar64 | ((short)uVar64 >= (short)uVar35) * uVar35;
    auVar42._0_2_ = -(ushort)(uVar37 == uVar23);
    auVar42._2_2_ = -(ushort)(uVar44 == uVar25);
    auVar42._4_2_ = -(ushort)(uVar46 == uVar27);
    auVar42._6_2_ = 0;
    auVar42._8_2_ = -(ushort)(uVar47 == uVar29);
    auVar42._10_2_ = -(ushort)(uVar48 == uVar31);
    auVar42._12_2_ = -(ushort)(uVar49 == uVar33);
    auVar42._14_2_ = -(ushort)(uVar50 == uVar35);
    auVar20._0_2_ = -(ushort)(uVar23 == uVar66);
    auVar20._2_2_ = -(ushort)(uVar25 == uVar68);
    auVar20._4_2_ = -(ushort)(uVar27 == uVar69);
    auVar20._6_2_ = 0;
    auVar20._8_2_ = -(ushort)(uVar29 == uVar70);
    auVar20._10_2_ = -(ushort)(uVar31 == uVar71);
    auVar20._12_2_ = -(ushort)(uVar33 == uVar72);
    auVar21._14_2_ = -(ushort)(uVar35 == uVar73);
    auVar21._0_14_ = auVar20;
    auVar8._14_2_ = 0;
    auVar8._0_14_ = auVar20;
    auVar41 = ~auVar42 &
              (~auVar21 & auVar41 |
              ZEXT516(CONCAT32((int3)((uint5)uVar7 >> 0x10),uVar19) & 0xffffff00ff) & auVar8) |
              auVar11 & auVar42;
    cVar36 = auVar41[0] + (char)*(undefined2 *)(row + lVar9);
    sVar57 = CONCAT11(auVar41[1],cVar36);
    cVar43 = auVar41[2] + (char)((ushort)*(undefined2 *)(row + lVar9) >> 8);
    uVar39 = CONCAT13(auVar41[3],CONCAT12(cVar43,sVar57));
    cVar45 = auVar41[4] + row[lVar9 + 2];
    sVar52 = (short)((uint)uVar39 >> 0x10);
    sVar55 = (short)(CONCAT15(auVar41[5],CONCAT14(cVar45,uVar39)) >> 0x20);
    *(ushort *)(row + lVar9) =
         CONCAT11((0 < sVar52) * (sVar52 < 0x100) * cVar43 - (0xff < sVar52),
                  (0 < sVar57) * (sVar57 < 0x100) * cVar36 - (0xff < sVar57));
    row[lVar9 + 2] = (0 < sVar55) * (sVar55 < 0x100) * cVar45 - (0xff < sVar55);
  }
  return;
}

Assistant:

void png_read_filter_row_paeth3_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* Paeth tries to predict pixel d using the pixel to the left of it, a,
    * and two pixels from the previous row, b and c:
    *   prev: c b
    *   row:  a d
    * The Paeth function predicts d to be whichever of a, b, or c is nearest to
    * p=a+b-c.
    *
    * The first pixel has no left context, and so uses an Up filter, p = b.
    * This works naturally with our main loop's p = a+b-c if we force a and c
    * to zero.
    * Here we zero b and d, which become c and a respectively at the start of
    * the loop.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i c, b = zero,
           a, d = zero;

   png_debug(1, "in png_read_filter_row_paeth3_sse2");

   rb = row_info->rowbytes;
   while (rb >= 4) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      __m128i pa,pb,pc,smallest,nearest;
      c = b; b = _mm_unpacklo_epi8(load4(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load4(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
   
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                 if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                             c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store3(row, _mm_packus_epi16(d,d));

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
   if (rb > 0) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      __m128i pa,pb,pc,smallest,nearest;
      c = b; b = _mm_unpacklo_epi8(load3(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load3(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                         if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                                     c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store3(row, _mm_packus_epi16(d,d));

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
}